

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_test.c
# Opt level: O0

void CheckPut(void *ptr,char *k,size_t klen,char *v,size_t vlen)

{
  int *state;
  size_t vlen_local;
  char *v_local;
  size_t klen_local;
  char *k_local;
  void *ptr_local;
  
  if (*ptr < 2) {
    if (*ptr == 0) {
      CheckEqual("bar",k,klen);
      CheckEqual("b",v,vlen);
    }
    else if (*ptr == 1) {
      CheckEqual("box",k,klen);
      CheckEqual("c",v,vlen);
    }
    *(int *)ptr = *ptr + 1;
    return;
  }
  fprintf(_stderr,"%s:%d: %s: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/c_test.c",
          0x53,phase,"*state < 2");
  abort();
}

Assistant:

static void CheckPut(void* ptr,
                     const char* k, size_t klen,
                     const char* v, size_t vlen) {
  int* state = (int*) ptr;
  CheckCondition(*state < 2);
  switch (*state) {
    case 0:
      CheckEqual("bar", k, klen);
      CheckEqual("b", v, vlen);
      break;
    case 1:
      CheckEqual("box", k, klen);
      CheckEqual("c", v, vlen);
      break;
  }
  (*state)++;
}